

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_mvcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  uint64_t uVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint64_t dest;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uintptr_t unaff_retaddr;
  uint64_t local_d8;
  int local_d0;
  uint32_t local_cc;
  S390Access local_80;
  S390Access local_58;
  
  uVar11 = (env->psw).mask;
  local_d0 = 3;
  if ((uVar11 >> 0x3a & 1) != 0) {
    switch((uint)(uVar11 >> 0x2e) & 3) {
    case 0:
      local_d0 = 0;
      break;
    case 1:
      abort();
    case 2:
      local_d0 = 1;
      break;
    case 3:
      local_d0 = 2;
    }
  }
  uVar3 = r1 + 1;
  uVar7 = (uint)env->regs[uVar3] & 0xffffff;
  uVar8 = (ulong)uVar7;
  dest = env->regs[(int)r1];
  iVar10 = (int)uVar11;
  if ((uVar11 >> 0x20 & 1) == 0) {
    if (iVar10 < 0) {
      dest = (uint64_t)((uint)dest & 0x7fffffff);
    }
    else {
      dest = (uint64_t)((uint)dest & 0xffffff);
    }
  }
  uVar9 = r2 + 1;
  uVar1 = env->regs[uVar9];
  uVar12 = (uint)uVar1 & 0xffffff;
  uVar13 = (ulong)uVar12;
  uVar4 = env->regs[(int)r2];
  local_d8 = uVar4;
  if ((uVar11 & 0x100000000) == 0) {
    if (iVar10 < 0) {
      uVar5 = (uint)uVar4 & 0x7fffffff;
    }
    else {
      uVar5 = (uint)uVar4 & 0xffffff;
    }
    local_d8 = (uint64_t)uVar5;
  }
  uVar5 = uVar7;
  if (uVar13 < uVar8) {
    uVar5 = uVar12;
  }
  _Var2 = is_destructive_overlap(env,dest,local_d8,uVar5);
  local_cc = 3;
  if ((!_Var2) && (local_cc = 0, uVar12 != uVar7)) {
    local_cc = 2 - (uVar7 < uVar12);
  }
  if (uVar8 == 0 || _Var2) {
    if ((uVar11 & 0x100000000) == 0) {
      uVar3 = 0x7fffffff;
      if (-1 < iVar10) {
        uVar3 = 0xffffff;
      }
      local_d8 = (ulong)((uint)local_d8 & uVar3) | uVar4 & 0xffffffff00000000;
    }
    env->regs[(int)r2] = local_d8;
    uVar11 = (env->psw).mask;
    if ((uVar11 & 0x100000000) == 0) {
      uVar3 = 0x7fffffff;
      if (-1 < (int)uVar11) {
        uVar3 = 0xffffff;
      }
      dest = (ulong)((uint)dest & uVar3) | env->regs[(int)r1] & 0xffffffff00000000;
    }
    env->regs[(int)r1] = dest;
  }
  else {
    if (uVar13 == 0) {
      uVar6 = local_d8;
      if ((uVar11 & 0x100000000) == 0) {
        uVar7 = 0x7fffffff;
        if (-1 < iVar10) {
          uVar7 = 0xffffff;
        }
        uVar6 = uVar4 & 0xffffffff00000000 | (ulong)(uVar7 & (uint)local_d8);
      }
      env->regs[(int)r2] = uVar6;
    }
    if (uVar8 != 0) {
      while( true ) {
        uVar11 = -(dest | 0xfffffffffffff000);
        if (uVar8 < -(dest | 0xfffffffffffff000)) {
          uVar11 = uVar8;
        }
        if (uVar13 == 0) {
          access_prepare(&local_80,env,dest,(int)uVar11,MMU_DATA_STORE,local_d0,unaff_retaddr);
          access_memset(env,&local_80,(uint8_t)(uVar1 >> 0x18),unaff_retaddr);
          uVar13 = 0;
        }
        else {
          uVar4 = -(local_d8 | 0xfffffffffffff000);
          if (uVar13 < -(local_d8 | 0xfffffffffffff000)) {
            uVar4 = uVar13;
          }
          if (uVar4 < uVar11) {
            uVar11 = uVar4;
          }
          access_prepare(&local_58,env,local_d8,(int)uVar11,MMU_DATA_LOAD,local_d0,unaff_retaddr);
          access_prepare(&local_80,env,dest,(int)uVar11,MMU_DATA_STORE,local_d0,unaff_retaddr);
          access_memmove(env,&local_80,&local_58,unaff_retaddr);
          local_d8 = local_d8 + uVar11;
          uVar4 = (env->psw).mask;
          if ((uVar4 & 0x100000000) == 0) {
            if ((int)uVar4 < 0) {
              uVar7 = (uint)local_d8 & 0x7fffffff;
            }
            else {
              uVar7 = (uint)local_d8 & 0xffffff;
            }
            local_d8 = (uint64_t)uVar7;
          }
          uVar13 = uVar13 - uVar11;
          env->regs[uVar9] =
               (ulong)((uint)uVar13 & 0xffffff) | env->regs[uVar9] & 0xffffffffff000000;
          uVar4 = (env->psw).mask;
          if ((uVar4 & 0x100000000) == 0) {
            uVar7 = 0x7fffffff;
            if (-1 < (int)uVar4) {
              uVar7 = 0xffffff;
            }
            env->regs[(int)r2] =
                 env->regs[(int)r2] & 0xffffffff00000000 | (ulong)((uint)local_d8 & uVar7);
          }
          else {
            env->regs[(int)r2] = local_d8;
          }
        }
        dest = dest + (uVar11 & 0xffffffff);
        uVar4 = (env->psw).mask;
        if ((uVar4 & 0x100000000) == 0) {
          if ((int)uVar4 < 0) {
            dest = (uint64_t)((uint)dest & 0x7fffffff);
          }
          else {
            dest = (uint64_t)((uint)dest & 0xffffff);
          }
        }
        uVar8 = uVar8 - (uVar11 & 0xffffffff);
        env->regs[uVar3] = (ulong)((uint)uVar8 & 0xffffff) | env->regs[uVar3] & 0xffffffffff000000;
        uVar11 = (env->psw).mask;
        uVar4 = dest;
        if ((uVar11 & 0x100000000) == 0) {
          uVar7 = 0x7fffffff;
          if (-1 < (int)uVar11) {
            uVar7 = 0xffffff;
          }
          uVar4 = env->regs[(int)r1] & 0xffffffff00000000 | (ulong)((uint)dest & uVar7);
        }
        env->regs[(int)r1] = uVar4;
        if (uVar8 == 0) break;
        iVar10._0_1_ = env[-1].cpu_state;
        iVar10._1_1_ = env[-1].sigp_order;
        iVar10._2_2_ = *(undefined2 *)&env[-1].field_0x4b2;
        if (iVar10 < 0) {
          cpu_loop_exit_restore_s390x((CPUState *)(env[-0x1e].vregs + 0xf),unaff_retaddr);
        }
      }
    }
  }
  return local_cc;
}

Assistant:

uint32_t HELPER(mvcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    uintptr_t ra = GETPC();
    uint64_t destlen = env->regs[r1 + 1] & 0xffffff;
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = env->regs[r2 + 1] & 0xffffff;
    uint64_t src = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    CPUState *cs = env_cpu(env);
    S390Access srca, desta;
    uint32_t cc, cur_len;

    if (is_destructive_overlap(env, dest, src, MIN(srclen, destlen))) {
        cc = 3;
    } else if (srclen == destlen) {
        cc = 0;
    } else if (destlen < srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    /* We might have to zero-out some bits even if there was no action. */
    if (unlikely(!destlen || cc == 3)) {
        set_address_zero(env, r2, src);
        set_address_zero(env, r1, dest);
        return cc;
    } else if (!srclen) {
        set_address_zero(env, r2, src);
    }

    /*
     * Only perform one type of type of operation (move/pad) in one step.
     * Stay within single pages.
     */
    while (destlen) {
        cur_len = MIN(destlen, -(dest | TARGET_PAGE_MASK));
        if (!srclen) {
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memset(env, &desta, pad, ra);
        } else {
            cur_len = MIN(MIN(srclen, -(src | TARGET_PAGE_MASK)), cur_len);

            srca = access_prepare(env, src, cur_len, MMU_DATA_LOAD, mmu_idx,
                                  ra);
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memmove(env, &desta, &srca, ra);
            src = wrap_address(env, src + cur_len);
            srclen -= cur_len;
            env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, srclen);
            set_address_zero(env, r2, src);
        }
        dest = wrap_address(env, dest + cur_len);
        destlen -= cur_len;
        env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, destlen);
        set_address_zero(env, r1, dest);

        /*
         * MVCL is interruptible. Return to the main loop if requested after
         * writing back all state to registers. If no interrupt will get
         * injected, we'll end up back in this handler and continue processing
         * the remaining parts.
         */
        if (destlen && unlikely(cpu_loop_exit_requested(cs))) {
            cpu_loop_exit_restore(cs, ra);
        }
    }
    return cc;
}